

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

bool mxx::impl::
     is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *begin,int *end,comm *param_3)

{
  bool bVar1;
  int iVar2;
  reference piVar3;
  byte local_59;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int local_50 [2];
  value_type left_el;
  int *local_40;
  byte local_31;
  comm *pcStack_30;
  bool sorted;
  comm *comm_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  _left_el = end;
  local_40 = begin;
  pcStack_30 = param_3;
  local_20._M_current = end;
  end_local._M_current = begin;
  local_31 = std::
             is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                       (begin,end);
  iVar2 = mxx::comm::size(pcStack_30);
  if (iVar2 == 1) {
    begin_local._M_current._7_1_ = (bool)(local_31 & 1);
  }
  else {
    local_58 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(&local_20,1);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_58);
    local_50[0] = right_shift<int>(piVar3,pcStack_30);
    iVar2 = mxx::comm::rank(pcStack_30);
    if (0 < iVar2) {
      local_59 = 0;
      if ((local_31 & 1) != 0) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&end_local);
        bVar1 = std::less<int>::operator()((less<int> *)((long)&comm_local + 7),piVar3,local_50);
        local_59 = bVar1 ^ 0xff;
      }
      local_31 = local_59 & 1;
    }
    begin_local._M_current._7_1_ = all_of((bool)(local_31 & 1),pcStack_30);
  }
  return begin_local._M_current._7_1_;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // check that it is locally sorted (int for MPI_Reduction)
    bool sorted = std::is_sorted(begin, end, comp);

    // if single process, this is it
    if (comm.size() == 1)
        return sorted;

    // compare if last element on left processor is not bigger than first
    // element on mine
    value_type left_el = mxx::right_shift(*(end-1), comm);

    // check if sorted with respect to neighbors
    if (comm.rank() > 0) {
        sorted = sorted && !comp(*begin, left_el);
    }

    // now check that this condition is true for all processes
    return mxx::all_of(sorted, comm);
}